

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

bool basist::basis_is_format_supported(transcoder_texture_format tex_type,basis_tex_format fmt)

{
  basis_tex_format fmt_local;
  transcoder_texture_format tex_type_local;
  bool local_1;
  
  if (fmt == cUASTC4x4) {
    if ((tex_type - cTFATC_RGB < 2) || (tex_type - cTFFXT1_RGB < 3)) {
      local_1 = false;
    }
    else {
      local_1 = true;
    }
  }
  else {
    switch(tex_type) {
    case cTFETC1:
    case cTFRGBA32:
    case cTFRGB565:
    case cTFBGR565:
    case cTFRGBA4444:
      local_1 = true;
      break;
    case cTFETC2:
      local_1 = true;
      break;
    case cTFBC1:
      local_1 = true;
      break;
    case cTFBC3:
      local_1 = true;
      break;
    case cTFBC4:
    case cTFBC5:
      local_1 = true;
      break;
    case cTFBC7_M5:
    case cTFBC7_ALT:
      local_1 = true;
      break;
    case cTFPVRTC1_4_RGB:
    case cTFPVRTC1_4_RGBA:
      local_1 = true;
      break;
    case cTFASTC_4x4:
      local_1 = true;
      break;
    case cTFATC_RGB:
    case cTFATC_RGBA:
      local_1 = true;
      break;
    default:
      local_1 = false;
      break;
    case cTFPVRTC2_4_RGB:
    case cTFPVRTC2_4_RGBA:
      local_1 = true;
      break;
    case cTFETC2_EAC_R11:
    case cTFETC2_EAC_RG11:
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool basis_is_format_supported(transcoder_texture_format tex_type, basis_tex_format fmt)
	{
		if (fmt == basis_tex_format::cUASTC4x4)
		{
#if BASISD_SUPPORT_UASTC
			switch (tex_type)
			{
				// These niche formats aren't currently supported for UASTC - everything else is.
			case transcoder_texture_format::cTFPVRTC2_4_RGB:
			case transcoder_texture_format::cTFPVRTC2_4_RGBA:
			case transcoder_texture_format::cTFATC_RGB:
			case transcoder_texture_format::cTFATC_RGBA:
			case transcoder_texture_format::cTFFXT1_RGB:
				return false;
			default:
				return true;
			}
#endif
		}
		else
		{
			switch (tex_type)
			{
				// ETC1 and uncompressed are always supported.
			case transcoder_texture_format::cTFETC1_RGB:
			case transcoder_texture_format::cTFRGBA32:
			case transcoder_texture_format::cTFRGB565:
			case transcoder_texture_format::cTFBGR565:
			case transcoder_texture_format::cTFRGBA4444:
				return true;
#if BASISD_SUPPORT_DXT1
			case transcoder_texture_format::cTFBC1_RGB:
				return true;
#endif
#if BASISD_SUPPORT_DXT5A
			case transcoder_texture_format::cTFBC4_R:
			case transcoder_texture_format::cTFBC5_RG:
				return true;
#endif
#if BASISD_SUPPORT_DXT1 && BASISD_SUPPORT_DXT5A
			case transcoder_texture_format::cTFBC3_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_PVRTC1
			case transcoder_texture_format::cTFPVRTC1_4_RGB:
			case transcoder_texture_format::cTFPVRTC1_4_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_BC7_MODE5
			case transcoder_texture_format::cTFBC7_RGBA:
			case transcoder_texture_format::cTFBC7_ALT:
				return true;
#endif
#if BASISD_SUPPORT_ETC2_EAC_A8
			case transcoder_texture_format::cTFETC2_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_ASTC		
			case transcoder_texture_format::cTFASTC_4x4_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_ATC
			case transcoder_texture_format::cTFATC_RGB:
			case transcoder_texture_format::cTFATC_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_FXT1
			case transcoder_texture_format::cTFFXT1_RGB:
				return true;
#endif
#if BASISD_SUPPORT_PVRTC2
			case transcoder_texture_format::cTFPVRTC2_4_RGB:
			case transcoder_texture_format::cTFPVRTC2_4_RGBA:
				return true;
#endif
#if BASISD_SUPPORT_ETC2_EAC_RG11
			case transcoder_texture_format::cTFETC2_EAC_R11:
			case transcoder_texture_format::cTFETC2_EAC_RG11:
				return true;
#endif
			default:
				break;
			}
		}

		return false;
	}